

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O3

void __thiscall MIDIStreamer::StartPlayback(MIDIStreamer *this)

{
  DWORD DVar1;
  uint uVar2;
  int iVar3;
  uint buffer_num;
  
  (*(this->super_MusInfo)._vptr_MusInfo[0x1a])();
  this->LoopLimit = 0;
  iVar3 = (*this->MIDI->_vptr_MIDIDevice[7])(this->MIDI,(ulong)(uint)this->Division);
  if (iVar3 == 0) {
    this->Tempo = this->InitialTempo;
    iVar3 = (*this->MIDI->_vptr_MIDIDevice[6])();
    if (iVar3 == 0) {
      (*(this->super_MusInfo)._vptr_MusInfo[2])(this);
      if (this->MIDI != (MIDIDevice *)0x0) {
        DVar1 = this->Volume;
        iVar3 = (*this->MIDI->_vptr_MIDIDevice[0xe])();
        if ((char)iVar3 != '\0') {
          this->NewVolume = DVar1;
          this->VolumeChanged = true;
        }
      }
      this->BufferNum = 0;
      buffer_num = 0;
      do {
        iVar3 = FillBuffer(this,buffer_num,0x80,100000);
        if (iVar3 != 0) {
LAB_0033e1f4:
          (*(this->super_MusInfo)._vptr_MusInfo[7])(this);
          return;
        }
        iVar3 = (*this->MIDI->_vptr_MIDIDevice[9])(this->MIDI,this->Buffer + this->BufferNum);
        if (iVar3 != 0) {
          Printf("Initial midiStreamOut failed\n");
          goto LAB_0033e1f4;
        }
        uVar2 = this->BufferNum;
        buffer_num = uVar2 ^ 1;
        this->BufferNum = buffer_num;
        if (uVar2 == 1) {
          return;
        }
      } while( true );
    }
  }
  Printf(200,"Setting MIDI stream speed failed\n");
  (*this->MIDI->_vptr_MIDIDevice[3])();
  return;
}

Assistant:

void MIDIStreamer::StartPlayback()
{
	Precache();
	LoopLimit = 0;

	// Set time division and tempo.
	if (0 != MIDI->SetTimeDiv(Division) ||
		0 != MIDI->SetTempo(Tempo = InitialTempo))
	{
		Printf(PRINT_BOLD, "Setting MIDI stream speed failed\n");
		MIDI->Close();
		return;
	}

	MusicVolumeChanged();	// set volume to current music's properties
	OutputVolume(Volume);

#ifdef _WIN32
	ResetEvent(ExitEvent);
	ResetEvent(BufferDoneEvent);
#endif

	// Fill the initial buffers for the song.
	BufferNum = 0;
	do
	{
		int res = FillBuffer(BufferNum, MAX_EVENTS, MAX_TIME);
		if (res == SONG_MORE)
		{
			if (0 != MIDI->StreamOutSync(&Buffer[BufferNum]))
			{
				Printf ("Initial midiStreamOut failed\n");
				Stop();
				return;
			}
			BufferNum ^= 1;
		}
		else if (res == SONG_DONE)
		{
			// Do not play super short songs that can't fill the initial two buffers.
			Stop();
			return;
		}
		else
		{
			Stop();
			return;
		}
	}
	while (BufferNum != 0);
}